

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O1

void fld_reduce(limb_t *res,limb_t *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = *x + 0x13;
  *res = uVar6;
  uVar1 = ((long)uVar6 >> 0x33) + x[1];
  res[1] = uVar1;
  uVar3 = ((long)uVar1 >> 0x33) + x[2];
  res[2] = uVar3;
  uVar4 = ((long)uVar3 >> 0x33) + x[3];
  res[3] = uVar4;
  uVar5 = ((long)uVar4 >> 0x33) + x[4];
  uVar6 = ((long)uVar5 >> 0x33) * 0x13 + (uVar6 & 0x7ffffffffffff);
  uVar2 = ((long)uVar6 >> 0x33) + (uVar1 & 0x7ffffffffffff);
  uVar1 = ((long)uVar2 >> 0x33) + (uVar3 & 0x7ffffffffffff);
  uVar3 = ((long)uVar1 >> 0x33) + (uVar4 & 0x7ffffffffffff);
  uVar4 = ((long)uVar3 >> 0x33) + (uVar5 & 0x7ffffffffffff);
  uVar6 = ((uVar6 & 0x7ffffffffffff) + ((long)uVar4 >> 0x33) * 0x13) - 0x13;
  uVar5 = ((long)uVar6 >> 0x33) + (uVar2 & 0x7ffffffffffff);
  uVar2 = ((long)uVar5 >> 0x33) + (uVar1 & 0x7ffffffffffff);
  uVar1 = ((long)uVar2 >> 0x33) + (uVar3 & 0x7ffffffffffff);
  uVar3 = ((long)uVar1 >> 0x33) + (uVar4 & 0x7ffffffffffff);
  *res = ((long)uVar3 >> 0x33) * 0x13 + (uVar6 & 0x7ffffffffffff);
  res[1] = uVar5 & 0x7ffffffffffff;
  res[2] = uVar2 & 0x7ffffffffffff;
  res[3] = uVar1 & 0x7ffffffffffff;
  res[4] = uVar3 & 0x7ffffffffffff;
  return;
}

Assistant:

void
fld_reduce(fld_t res, const fld_t x)
{
	/* first carry round with offset 19 */
	res[0] = x[0] + 19;
	res[1] = x[1] + (res[0] >> FLD_LIMB_BITS);
	res[2] = x[2] + (res[1] >> FLD_LIMB_BITS);
	res[3] = x[3] + (res[2] >> FLD_LIMB_BITS);
	res[4] = x[4] + (res[3] >> FLD_LIMB_BITS);

	/* -2^12 <= (res[4] >> FLD_LIMB_BITS) <= 2^12-1 */
	res[0] = (res[0] & FLD_LIMB_MASK) + 19*(res[4] >> FLD_LIMB_BITS);
	res[1] &= FLD_LIMB_MASK;
	res[2] &= FLD_LIMB_MASK;
	res[3] &= FLD_LIMB_MASK;
	res[4] &= FLD_LIMB_MASK;

	/* now we have
	 *   -19*2^12 <= res[0] <= 2^51-1 + 19*(2^12-1),
	 * and
	 *   0 <= res[i] <= 2^51-1 for 1 <= i <= 4.
	 */

	/* second round */
	res[1] += (res[0] >> FLD_LIMB_BITS);
	res[2] += (res[1] >> FLD_LIMB_BITS);
	res[3] += (res[2] >> FLD_LIMB_BITS);
	res[4] += (res[3] >> FLD_LIMB_BITS);

	/* -1 <= (res[4] >> FLD_LIMB_BITS) <= 1 */
	res[0] = (res[0] & FLD_LIMB_MASK) + 19*(res[4] >> FLD_LIMB_BITS);

	res[1] &= FLD_LIMB_MASK;
	res[2] &= FLD_LIMB_MASK;
	res[3] &= FLD_LIMB_MASK;
	res[4] &= FLD_LIMB_MASK;

	/* the second round yields 
	 *   -19 <= res[0] <= 2^51-1 + 19
	 * and
	 *   0 <= res[i] <= 2^51-1 for 1 <= i <= 4.
	 */
	res[0] -= 19;

	/* with the offset removed we have
	 *   -38 <= res[0] <= 2^51-1
	 * and need a third round to assure that res[0] is non-negative.
	 *
	 * please note, that no positive carry is possible at this point.
	 */

	res[1] += (res[0] >> FLD_LIMB_BITS);
	res[2] += (res[1] >> FLD_LIMB_BITS);
	res[3] += (res[2] >> FLD_LIMB_BITS);
	res[4] += (res[3] >> FLD_LIMB_BITS);

	/* -1 <= (res[4] >> FLD_LIMB_BITS) <= 0, because of non-positive carry */
	res[0] = (res[0] & FLD_LIMB_MASK) + 19*(res[4] >> FLD_LIMB_BITS);

	res[1] &= FLD_LIMB_MASK;
	res[2] &= FLD_LIMB_MASK;
	res[3] &= FLD_LIMB_MASK;
	res[4] &= FLD_LIMB_MASK;


	/* if res[0] was negative before this round we had an negative carry and
	 * have now
	 *   2^51 - 38 - 19 <= res[0] <= 2^51 - 1.
	 *
	 * so in any case it is
	 *   0 <= res[0] <= 2^51 - 1
	 * and
	 *   0 <= res[i] <= 2^51 - 1 for 1 <= i <= 4
	 * as wished.
	 *
	 * moreover res is the smallest non-negative representant of x modulo q.
	 */
}